

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

bool duckdb_fast_float::fastfloat_strncasecmp(char *input1,char *input2,size_t length)

{
  byte bVar1;
  size_t i;
  size_t sVar2;
  
  bVar1 = 0;
  for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = bVar1 | input2[sVar2] ^ input1[sVar2];
  }
  return (bVar1 & 0xdf) == 0;
}

Assistant:

inline bool fastfloat_strncasecmp(const char *input1, const char *input2,
                                  size_t length) {
  char running_diff{0};
  for (size_t i = 0; i < length; i++) {
    running_diff |= (input1[i] ^ input2[i]);
  }
  return (running_diff == 0) || (running_diff == 32);
}